

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

void __thiscall vera::Shader::use(Shader *this)

{
  undefined1 in_AL;
  undefined7 in_register_00000001;
  GLint currentProgram;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = (uint)CONCAT71(in_register_00000001,in_AL);
  if (((this->m_program == 0) || (this->m_needsReloading != false)) ||
     ((this->super_HaveDefines).m_defineChange == true)) {
    load(this,&this->m_fragmentSource,&this->m_vertexSource,this->m_error_screen,false);
  }
  uStack_18 = (ulong)(uint)uStack_18;
  glGetIntegerv(0x8b8d,(long)&uStack_18 + 4);
  if (this->m_program != uStack_18._4_4_) {
    glUseProgram();
  }
  this->textureIndex = 0;
  return;
}

Assistant:

void Shader::use() {
    if (isDirty())
        load(m_fragmentSource, m_vertexSource, m_error_screen, false);

    if (!inUse())
        glUseProgram(getProgram());
        
    textureIndex = 0;
}